

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::scanHeaderName(TPpContext *this,TPpToken *ppToken,char delimit)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference pptVar4;
  int local_28;
  int ch;
  int len;
  bool tooLong;
  char delimit_local;
  TPpToken *ppToken_local;
  TPpContext *this_local;
  
  bVar1 = false;
  bVar2 = std::vector<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
          ::empty(&this->inputStack);
  if (bVar2) {
    this_local._4_4_ = -1;
  }
  else {
    local_28 = 0;
    ppToken->name[0] = '\0';
    while( true ) {
      pptVar4 = std::
                vector<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                ::back(&this->inputStack);
      iVar3 = (*(*pptVar4)->_vptr_tInput[3])();
      if (iVar3 == delimit) break;
      if (iVar3 == -1) {
        return -1;
      }
      if (local_28 < 0x400) {
        ppToken->name[local_28] = (char)iVar3;
        local_28 = local_28 + 1;
      }
      else {
        bVar1 = true;
      }
    }
    ppToken->name[local_28] = '\0';
    if (bVar1) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"header name too long","");
    }
    this_local._4_4_ = 0xa1;
  }
  return this_local._4_4_;
}

Assistant:

int TPpContext::scanHeaderName(TPpToken* ppToken, char delimit)
{
    bool tooLong = false;

    if (inputStack.empty())
        return EndOfInput;

    int len = 0;
    ppToken->name[0] = '\0';
    do {
        int ch = inputStack.back()->getch();

        // done yet?
        if (ch == delimit) {
            ppToken->name[len] = '\0';
            if (tooLong)
                parseContext.ppError(ppToken->loc, "header name too long", "", "");
            return PpAtomConstString;
        } else if (ch == EndOfInput)
            return EndOfInput;

        // found a character to expand the name with
        if (len < MaxTokenLength)
            ppToken->name[len++] = (char)ch;
        else
            tooLong = true;
    } while (true);
}